

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.h
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildNode::BuildNode(BuildNode *this,StringRef name,NodeType type)

{
  Node::Node(&this->super_Node,name);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__BuildNode_002034a8;
  this->type = type;
  this->commandTimestamp = false;
  this->mutated = false;
  (this->exclusionPatterns).contents = (char *)0x0;
  (this->exclusionPatterns).size = 0;
  (this->mustScanAfterPaths).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mustScanAfterPaths).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mustScanAfterPaths).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit BuildNode(StringRef name, NodeType type)
      : Node(name), type(type) {}